

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

void avro::parsing::testCodec<avro::parsing::BinaryCodecFactory>(TestData *td)

{
  char **t;
  uint uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  auto_ptr<avro::OutputStream> p;
  auto_ptr<avro::InputStream> in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  const_string local_1f8;
  const_string local_1e8;
  ValidSchema vs;
  undefined1 local_1c8 [408];
  
  testCodec<avro::parsing::BinaryCodecFactory>::testNo =
       testCodec<avro::parsing::BinaryCodecFactory>::testNo + 1;
  makeValidSchema((parsing *)&vs,td->schema);
  t = &td->calls;
  for (iVar5 = 0; iVar5 != 10; iVar5 = iVar5 + 1) {
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p._M_ptr = (OutputStream *)0x0;
    avro::binaryEncoder();
    testEncoder((EncoderPtr *)local_1c8,*t,&v,&p);
    boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
    iVar6 = 0;
    for (uVar4 = 0; uVar1 = td->depth, uVar4 <= uVar1; uVar4 = uVar4 + 1) {
      local_1e8.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
      ;
      local_1e8.m_end = "";
      memset((basic_wrap_stringstream<char> *)local_1c8,0,0x198);
      boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
                ((basic_wrap_stringstream<char> *)local_1c8);
      std::operator<<((ostream *)local_1c8,"Test: ");
      pbVar2 = boost::operator<<((basic_wrap_stringstream<char> *)local_1c8,
                                 &testCodec<avro::parsing::BinaryCodecFactory>::testNo);
      std::operator<<((ostream *)pbVar2,' ');
      std::operator<<((ostream *)pbVar2," schema: ");
      pbVar2 = boost::operator<<(pbVar2,&td->schema);
      std::operator<<((ostream *)pbVar2," calls: ");
      pbVar2 = boost::operator<<(pbVar2,t);
      std::operator<<((ostream *)pbVar2," skip-level: ");
      std::ostream::_M_insert<unsigned_long>((ulong)pbVar2);
      pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
      local_1f8.m_begin = (pbVar3->_M_dataplus)._M_p;
      local_1f8.m_end = local_1f8.m_begin + pbVar3->_M_string_length;
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)pbVar2,&local_1e8,0x279,&local_1f8);
      boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
                ((basic_wrap_stringstream<char> *)local_1c8);
      avro::memoryInputStream((OutputStream *)&in);
      avro::binaryDecoder();
      testDecoder((DecoderPtr *)local_1c8,&v,_in,*t,uVar1 + iVar6);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
      if (_in != (InputStream *)0x0) {
        (**(code **)(*(long *)_in + 8))();
      }
      iVar6 = iVar6 + -1;
    }
    if (p._M_ptr != (OutputStream *)0x0) {
      (**(code **)(*(long *)p._M_ptr + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&v);
  }
  boost::detail::shared_count::~shared_count(&vs.root_.pn);
  return;
}

Assistant:

void testCodec(const TestData& td) {
    static int testNo = 0;
    testNo++;

    ValidSchema vs = makeValidSchema(td.schema);

    for (unsigned int i = 0; i < count; ++i) {
        vector<string> v;
        auto_ptr<OutputStream> p;
        testEncoder(CodecFactory::newEncoder(vs), td.calls, v, p);
        // dump(*p);

        for (unsigned int i = 0; i <= td.depth; ++i) {
            unsigned int skipLevel = td.depth - i;
            /*
            std::cout << "Test: " << testNo << ' '
                << " schema: " << td.schema
                << " calls: " << td.calls
                << " skip-level: " << skipLevel << std::endl;
                */
            BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
                << " schema: " << td.schema
                << " calls: " << td.calls
                << " skip-level: " << skipLevel);
            auto_ptr<InputStream> in = memoryInputStream(*p);
            testDecoder(CodecFactory::newDecoder(vs), v, *in,
                td.calls, skipLevel);
        }
    }
}